

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O0

void UNGET(int c,_PDCLIB_status_t *status)

{
  _PDCLIB_status_t *status_local;
  int c_local;
  
  if (status->stream == (_PDCLIB_file_t *)0x0) {
    status->s = status->s + -1;
  }
  else {
    ungetc(c,(FILE *)status->stream);
  }
  status->i = status->i - 1;
  status->current = status->current - 1;
  return;
}

Assistant:

static void UNGET( int c, struct _PDCLIB_status_t * status )
{
    if ( status->stream != NULL )
    {
        ungetc( c, status->stream ); /* TODO: Error? */
    }
    else
    {
        --( status->s );
    }

    --( status->i );
    --( status->current );
}